

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

void __thiscall Qclass::createGrid(Qclass *this)

{
  ostream *poVar1;
  long local_220;
  ofstream outfile;
  int local_20;
  int local_1c;
  int j_1;
  int i_1;
  int j;
  int i;
  Qclass *this_local;
  
  for (i_1 = 0x1e; i_1 < 0x2e; i_1 = i_1 + 1) {
    for (j_1 = 0x28; j_1 < 0x2e; j_1 = j_1 + 1) {
      this->grid[i_1][j_1] = 1;
    }
  }
  for (local_1c = 10; local_1c < 0x15; local_1c = local_1c + 1) {
    for (local_20 = 10; local_20 < 0x1f; local_20 = local_20 + 1) {
      this->grid[local_1c][local_20] = 1;
    }
  }
  std::ofstream::ofstream(&local_220);
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)&local_220,0x10810d);
  std::ios_base::precision((ios_base *)((long)&local_220 + *(long *)(local_220 + -0x18)),6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,0x28);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,0x2d);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2d);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,0x2d);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2d);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,0x28);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,0x28);
  std::ofstream::close();
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)&local_220,0x108120);
  std::ios_base::precision((ios_base *)((long)&local_220 + *(long *)(local_220 + -0x18)),6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,10);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,0x1e);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,0x1e);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,10);
  std::ostream::operator<<((ostream *)&local_220,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_220,std::fixed);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
  poVar1 = std::operator<<(poVar1,"   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  std::ostream::operator<<(poVar1,10);
  std::ofstream::close();
  std::ofstream::~ofstream(&local_220);
  return;
}

Assistant:

void Qclass::createGrid() {
  for (int i = 30; i < 46; i++) {
    for (int j = 40; j < 46; j++) {
      grid[i][j] = 1;
    }
  }
  for (int i = 10; i < 21; i++) {
    for (int j = 10; j < 31; j++) {
      grid[i][j] = 1;
    }
  }
  std::ofstream outfile;
  outfile.open("Obstacles1.txt", std::ios::out | std::ios::trunc);
  outfile.precision(6);
  outfile << std::fixed << 30 << "   " << std::fixed << 40;
  outfile << std::endl;
  outfile << std::fixed << 30 << "   " << std::fixed << 45;
  outfile << std::endl;
  outfile << std::fixed << 45 << "   " << std::fixed << 45;
  outfile << std::endl;
  outfile << std::fixed << 45 << "   " << std::fixed << 40;
  outfile << std::endl;
  outfile << std::fixed << 30 << "   " << std::fixed << 40;
  outfile.close();
  outfile.open("Obstacles2.txt", std::ios::out | std::ios::trunc);
  outfile.precision(6);
  outfile << std::fixed << 10 << "   " << std::fixed << 10;
  outfile << std::endl;
  outfile << std::fixed << 10 << "   " << std::fixed << 30;
  outfile << std::endl;
  outfile << std::fixed << 20 << "   " << std::fixed << 30;
  outfile << std::endl;
  outfile << std::fixed << 20 << "   " << std::fixed << 10;
  outfile << std::endl;
  outfile << std::fixed << 10 << "   " << std::fixed << 10;
  outfile.close();
}